

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation_tests.cpp
# Opt level: O2

void __thiscall txreconciliation_tests::RegisterPeerTest::test_method(RegisterPeerTest *this)

{
  long lVar1;
  bool bVar2;
  readonly_property<bool> rVar3;
  ReconciliationRegisterResult RVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  assertion_result *paVar6;
  iterator pvVar7;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  char **ppcVar8;
  char *pcVar9;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  assertion_result local_c8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  lazy_ostream local_80;
  undefined1 *local_70;
  char **local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  TxReconciliationTracker tracker;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TxReconciliationTracker::TxReconciliationTracker(&tracker,1);
  TxReconciliationTracker::PreRegisterPeer(&tracker,0);
  local_50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x18;
  file.m_begin = (iterator)&local_50;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_60,msg);
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (char **)0xc694e1;
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_88 = "";
  local_c8._0_4_ = TxReconciliationTracker::RegisterPeer(&tracker,0,true,0,0);
  paVar6 = &local_c8;
  local_d8 = (char *)CONCAT44(local_d8._4_4_,3);
  pvVar5 = (iterator)0x2;
  ppcVar8 = &local_d8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ReconciliationRegisterResult,ReconciliationRegisterResult>
            (&local_80,&local_90,0x18,1,2,paVar6,"tracker.RegisterPeer( 0, true, 0, salt)",&local_d8
             ,"ReconciliationRegisterResult::PROTOCOL_VIOLATION");
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)paVar6;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0x1b;
  file_00.m_begin = (iterator)&local_a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_b0,msg_00
            );
  bVar2 = TxReconciliationTracker::IsPeerRegistered(&tracker,0);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = "!tracker.IsPeerRegistered(0)";
  local_d0 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_e0 = "";
  pvVar5 = (iterator)0x2;
  pvVar7 = (iterator)0x0;
  local_68 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_80,2,0,WARN,(check_type)ppcVar8,(size_t)&local_e8,0x1b);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar5;
  file_01.m_end = (iterator)0x1c;
  file_01.m_begin = (iterator)&local_f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_108,
             msg_01);
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (char **)0xc694e1;
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_110 = "";
  local_c8._0_4_ = TxReconciliationTracker::RegisterPeer(&tracker,0,true,1,0);
  paVar6 = &local_c8;
  local_d8 = (char *)CONCAT44(local_d8._4_4_,1);
  pcVar9 = "ReconciliationRegisterResult::SUCCESS";
  pvVar5 = (iterator)0x2;
  ppcVar8 = &local_d8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ReconciliationRegisterResult,ReconciliationRegisterResult>
            (&local_80,&local_118,0x1c);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)paVar6;
  msg_02.m_begin = pvVar5;
  file_02.m_end = (iterator)0x1d;
  file_02.m_begin = (iterator)&local_128;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_138,
             msg_02);
  rVar3.super_class_property<bool>.value =
       (class_property<bool>)TxReconciliationTracker::IsPeerRegistered(&tracker,0);
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = "tracker.IsPeerRegistered(0)";
  local_d0 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_140 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_68 = &local_d8;
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_80,1,0,WARN,(check_type)ppcVar8,(size_t)&local_148,0x1d,pcVar9);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar5;
  file_03.m_end = (iterator)0x1e;
  file_03.m_begin = (iterator)&local_158;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_168,
             msg_03);
  bVar2 = TxReconciliationTracker::IsPeerRegistered(&tracker,1);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = "!tracker.IsPeerRegistered(1)";
  local_d0 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_170 = "";
  pvVar5 = (iterator)0x2;
  pvVar7 = (iterator)0x0;
  local_68 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_80,2,0,WARN,(check_type)ppcVar8,(size_t)&local_178,0x1e);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  TxReconciliationTracker::PreRegisterPeer(&tracker,1);
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar5;
  file_04.m_end = (iterator)0x20;
  file_04.m_begin = (iterator)&local_188;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_198,
             msg_04);
  RVar4 = TxReconciliationTracker::RegisterPeer(&tracker,1,false,1,0);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(RVar4 == SUCCESS);
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = "tracker.RegisterPeer(1, false, 1, salt) == ReconciliationRegisterResult::SUCCESS";
  local_d0 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_1a0 = "";
  pvVar5 = (iterator)0x2;
  pvVar7 = (iterator)0x0;
  local_68 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_80,2,0,WARN,(check_type)ppcVar8,(size_t)&local_1a8,0x20);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar5;
  file_05.m_end = (iterator)0x21;
  file_05.m_begin = (iterator)&local_1b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1c8,
             msg_05);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TxReconciliationTracker::IsPeerRegistered(&tracker,1);
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = "tracker.IsPeerRegistered(1)";
  local_d0 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_1d0 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_68 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_80,1,0,WARN,(check_type)ppcVar8,(size_t)&local_1d8,0x21);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar5;
  file_06.m_end = (iterator)0x24;
  file_06.m_begin = (iterator)&local_1e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1f8,
             msg_06);
  bVar2 = TxReconciliationTracker::IsPeerRegistered(&tracker,2);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = "!tracker.IsPeerRegistered(2)";
  local_d0 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_200 = "";
  pvVar5 = (iterator)0x2;
  pvVar7 = (iterator)0x0;
  local_68 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_80,2,0,WARN,(check_type)ppcVar8,(size_t)&local_208,0x24);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  TxReconciliationTracker::PreRegisterPeer(&tracker,2);
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar7;
  msg_07.m_begin = pvVar5;
  file_07.m_end = (iterator)0x26;
  file_07.m_begin = (iterator)&local_218;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_228,
             msg_07);
  RVar4 = TxReconciliationTracker::RegisterPeer(&tracker,2,true,2,0);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(RVar4 == SUCCESS);
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = "tracker.RegisterPeer(2, true, 2, salt) == ReconciliationRegisterResult::SUCCESS";
  local_d0 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_230 = "";
  pvVar5 = (iterator)0x2;
  pvVar7 = (iterator)0x0;
  local_68 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_80,2,0,WARN,(check_type)ppcVar8,(size_t)&local_238,0x26);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar7;
  msg_08.m_begin = pvVar5;
  file_08.m_end = (iterator)0x27;
  file_08.m_begin = (iterator)&local_248;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_258,
             msg_08);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TxReconciliationTracker::IsPeerRegistered(&tracker,2);
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = "tracker.IsPeerRegistered(2)";
  local_d0 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_260 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_68 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_80,1,0,WARN,(check_type)ppcVar8,(size_t)&local_268,0x27);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar7;
  msg_09.m_begin = pvVar5;
  file_09.m_end = (iterator)0x2a;
  file_09.m_begin = (iterator)&local_278;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_288,
             msg_09);
  RVar4 = TxReconciliationTracker::RegisterPeer(&tracker,1,false,1,0);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(RVar4 == ALREADY_REGISTERED);
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = 
  "tracker.RegisterPeer(1, false, 1, salt) == ReconciliationRegisterResult::ALREADY_REGISTERED";
  local_d0 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_290 = "";
  pvVar5 = (iterator)0x2;
  pvVar7 = (iterator)0x0;
  local_68 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_80,2,0,WARN,(check_type)ppcVar8,(size_t)&local_298,0x2a);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar7;
  msg_10.m_begin = pvVar5;
  file_10.m_end = (iterator)0x2d;
  file_10.m_begin = (iterator)&local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2b8,
             msg_10);
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (char **)0xc694e1;
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_2c0 = "";
  local_c8._0_4_ = TxReconciliationTracker::RegisterPeer(&tracker,100,true,1,0);
  paVar6 = &local_c8;
  local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
  pcVar9 = "ReconciliationRegisterResult::NOT_FOUND";
  pvVar5 = (iterator)0x2;
  ppcVar8 = &local_d8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ReconciliationRegisterResult,ReconciliationRegisterResult>
            (&local_80,&local_2c8,0x2d);
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = (iterator)paVar6;
  msg_11.m_begin = pvVar5;
  file_11.m_end = (iterator)0x2e;
  file_11.m_begin = (iterator)&local_2d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2e8,
             msg_11);
  bVar2 = TxReconciliationTracker::IsPeerRegistered(&tracker,100);
  local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_c8.m_message.px = (element_type *)0x0;
  local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = "!tracker.IsPeerRegistered(100)";
  local_d0 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txreconciliation_tests.cpp"
  ;
  local_2f0 = "";
  local_68 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_c8,&local_80,1,0,WARN,(check_type)ppcVar8,(size_t)&local_2f8,0x2e,pcVar9);
  boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
  TxReconciliationTracker::~TxReconciliationTracker(&tracker);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(RegisterPeerTest)
{
    TxReconciliationTracker tracker(TXRECONCILIATION_VERSION);
    const uint64_t salt = 0;

    // Prepare a peer for reconciliation.
    tracker.PreRegisterPeer(0);

    // Invalid version.
    BOOST_CHECK_EQUAL(tracker.RegisterPeer(/*peer_id=*/0, /*is_peer_inbound=*/true,
                                           /*peer_recon_version=*/0, salt),
                      ReconciliationRegisterResult::PROTOCOL_VIOLATION);

    // Valid registration (inbound and outbound peers).
    BOOST_REQUIRE(!tracker.IsPeerRegistered(0));
    BOOST_REQUIRE_EQUAL(tracker.RegisterPeer(0, true, 1, salt), ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(0));
    BOOST_REQUIRE(!tracker.IsPeerRegistered(1));
    tracker.PreRegisterPeer(1);
    BOOST_REQUIRE(tracker.RegisterPeer(1, false, 1, salt) == ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(1));

    // Reconciliation version is higher than ours, should be able to register.
    BOOST_REQUIRE(!tracker.IsPeerRegistered(2));
    tracker.PreRegisterPeer(2);
    BOOST_REQUIRE(tracker.RegisterPeer(2, true, 2, salt) == ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(2));

    // Try registering for the second time.
    BOOST_REQUIRE(tracker.RegisterPeer(1, false, 1, salt) == ReconciliationRegisterResult::ALREADY_REGISTERED);

    // Do not register if there were no pre-registration for the peer.
    BOOST_REQUIRE_EQUAL(tracker.RegisterPeer(100, true, 1, salt), ReconciliationRegisterResult::NOT_FOUND);
    BOOST_CHECK(!tracker.IsPeerRegistered(100));
}